

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

string * __thiscall
wabt::LoadStoreTracking::GenAlign_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Address align,Opcode opc)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Address AVar4;
  string __str;
  Opcode local_44;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_0000000c,opc.enum_);
  local_44.enum_ = opc.enum_;
  bVar2 = Opcode::IsNaturallyAligned(&local_44,align);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cVar3 = '\x01';
    if (9 < align) {
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd1b71759;
      AVar4 = align;
      cVar1 = '\x04';
      do {
        cVar3 = cVar1;
        if (AVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00155565;
        }
        if (AVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00155565;
        }
        if (AVar4 < 10000) goto LAB_00155565;
        bVar2 = 99999 < AVar4;
        AVar4 = AVar4 / 10000;
        cVar1 = cVar3 + '\x04';
      } while (bVar2);
      cVar3 = cVar3 + '\x01';
    }
LAB_00155565:
    local_40 = local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_40,local_38,align);
    cat<char[2],std::__cxx11::string>
              (__return_storage_ptr__,(wabt *)"@",(char (*) [2])&local_40,args_1);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenAlign(Address align, Opcode opc) const {
    return opc.IsNaturallyAligned(align)
      ? ""
      : cat("@", std::to_string(align));
  }